

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Performance::ShaderCompilerCase::init(ShaderCompilerCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)CONCAT44(extraout_var_00,iVar2);
  if (0x3f < iVar3) {
    iVar3 = 0x40;
  }
  this->m_viewportWidth = iVar3;
  iVar3 = ((int *)CONCAT44(extraout_var_00,iVar2))[1];
  iVar2 = 0x40;
  if (iVar3 < 0x40) {
    iVar2 = iVar3;
  }
  this->m_viewportHeight = iVar2;
  iVar3 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1a00))(0,0);
  return iVar3;
}

Assistant:

void ShaderCompilerCase::init (void)
{
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderContext().getRenderTarget();

	m_viewportWidth		= deMin32(MAX_VIEWPORT_WIDTH, renderTarget.getWidth());
	m_viewportHeight	= deMin32(MAX_VIEWPORT_HEIGHT, renderTarget.getHeight());

	gl.viewport(0, 0, m_viewportWidth, m_viewportHeight);
}